

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.cpp
# Opt level: O0

void __thiscall
CVmPoolPaged::attach_backing_store(CVmPoolPaged *this,CVmPoolBackingStore *backing_store)

{
  CVmPoolBackingStore *in_RDI;
  CVmPoolPaged *unaff_retaddr;
  size_t log2;
  size_t cur;
  int iVar1;
  CVmPoolPaged *in_stack_ffffffffffffffe0;
  _func_int **local_18;
  CVmPoolBackingStore *nslots;
  
  nslots = in_RDI;
  delete_page_list(in_stack_ffffffffffffffe0);
  CVmPool::attach_backing_store(&in_stack_ffffffffffffffe0->super_CVmPool,in_RDI);
  if (in_RDI[1]._vptr_CVmPoolBackingStore == (_func_int **)0x0) {
    in_RDI[1]._vptr_CVmPoolBackingStore = (_func_int **)0x400;
  }
  iVar1 = 0;
  for (local_18 = in_RDI[1]._vptr_CVmPoolBackingStore; ((ulong)local_18 & 1) == 0;
      local_18 = (_func_int **)((ulong)local_18 >> 1)) {
    iVar1 = iVar1 + 1;
  }
  if (local_18 != (_func_int **)0x1) {
    err_throw(0);
  }
  *(int *)&in_RDI[6]._vptr_CVmPoolBackingStore = iVar1;
  (**(code **)(*in_RDI[2]._vptr_CVmPoolBackingStore + 0x10))();
  alloc_page_slots(unaff_retaddr,(size_t)nslots);
  return;
}

Assistant:

void CVmPoolPaged::attach_backing_store(CVmPoolBackingStore *backing_store)
{
    size_t cur;
    size_t log2;

    /* delete any existing page list */
    delete_page_list();

    /* inherit default handling */
    CVmPool::attach_backing_store(backing_store);

    /* 
     *   if the page size is zero, there must not be any pages at all -
     *   use a dummy default page size
     */
    if (page_size_ == 0)
        page_size_ = 1024;

    /*
     *   Compute log2 of the page size.  If the page size isn't a power of
     *   two, throw an error. 
     */
    for (cur = page_size_, log2 = 0 ; (cur & 1) == 0 ; cur >>= 1, ++log2) ;
    if (cur != 1)
        err_throw(VMERR_BAD_POOL_PAGE_SIZE);

    /* store log2(page_size_) in log2_page_size_ */
    log2_page_size_ = log2;

    /* allocate the pages */
    alloc_page_slots(backing_store_->vmpbs_get_page_count());
}